

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<absl::lts_20250127::Cord>::TestBody
          (NoFieldPresenceSerializeTest_DontSerializeDefaultValuesTest_Test<absl::lts_20250127::Cord>
           *this)

{
  Arena *pAVar1;
  Cord *output;
  char *in_R9;
  char *pcVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_308;
  AssertHelper local_300;
  AssertionResult gtest_ar_;
  string local_2e8;
  undefined1 local_2c8 [528];
  ArenaStringPtr local_b8;
  ArenaStringPtr local_b0 [7];
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  undefined8 local_34;
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_2c8);
  output = &(this->super_NoFieldPresenceSerializeTest<absl::lts_20250127::Cord>).value_;
  gtest_ar_.success_ = MessageLite::SerializeToString((MessageLite *)local_2c8,output);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    local_300.data_._0_4_ = 0;
    absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
    local_308._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_2e8._M_string_length;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar_,"0","this->GetOutput().size()",(int *)&local_300,
               (unsigned_long *)&local_308);
    std::__cxx11::string::~string((string *)&local_2e8);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_2e8);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar2 = *(char **)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x455,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
      if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    local_b0[6].tagged_ptr_.ptr_ = (TaggedStringPtr)(void *)0x0;
    _uStack_78 = 0;
    local_70 = 0;
    uStack_68 = 0;
    local_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0.0;
    local_38 = false;
    local_2c8._16_4_ = local_2c8._16_4_ | 0x1fff01;
    pAVar1 = (Arena *)local_2c8._8_8_;
    if ((local_2c8._8_8_ & 1) != 0) {
      pAVar1 = *(Arena **)(local_2c8._8_8_ & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)(local_2c8 + 0x208),anon_var_dwarf_651463 + 5,pAVar1);
    local_2c8._16_4_ = local_2c8._16_4_ | 2;
    pAVar1 = (Arena *)local_2c8._8_8_;
    if ((local_2c8._8_8_ & 1) != 0) {
      pAVar1 = *(Arena **)(local_2c8._8_8_ & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set(&local_b8,anon_var_dwarf_651463 + 5,pAVar1);
    local_34 = 0;
    local_2c8._16_4_ = local_2c8._16_4_ | 0x600004;
    if ((local_2c8._8_8_ & 1) != 0) {
      local_2c8._8_8_ = *(undefined8 *)(local_2c8._8_8_ & 0xfffffffffffffffe);
    }
    pcVar2 = anon_var_dwarf_651463 + 5;
    internal::ArenaStringPtr::Set(local_b0,anon_var_dwarf_651463 + 5,(Arena *)local_2c8._8_8_);
    gtest_ar_.success_ = MessageLite::SerializeToString((MessageLite *)local_2c8,output);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      local_300.data_._0_4_ = 0;
      absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
      local_308._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_2e8._M_string_length;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&gtest_ar_,"0","this->GetOutput().size()",(int *)&local_300,
                 (unsigned_long *)&local_308);
      std::__cxx11::string::~string((string *)&local_2e8);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_2e8);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_308,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x46c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
        if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      uStack_78 = 1;
      local_2c8._16_4_ = local_2c8._16_4_ | 0x200;
      gtest_ar_.success_ = MessageLite::SerializeToString((MessageLite *)local_2c8,output);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (gtest_ar_.success_) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        local_300.data_._0_4_ = 2;
        absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
        local_308._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2e8._M_string_length;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&gtest_ar_,"2","this->GetOutput().size()",(int *)&local_300,
                   (unsigned_long *)&local_308);
        std::__cxx11::string::~string((string *)&local_2e8);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_2e8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar2 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_308,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x470,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_308,(Message *)&local_2e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
          if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
        testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                  ((internal *)&gtest_ar_,"\"\\x08\\x01\"","this->GetOutput()",
                   (char (*) [3])0xe1bf9f,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_2e8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar2 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_308,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x471,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_308,(Message *)&local_2e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
          if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        _uStack_78 = _uStack_78 & 0xffffffff00000000;
        local_2c8._16_4_ = local_2c8._16_4_ | 0x200;
        gtest_ar_.success_ = MessageLite::SerializeToString((MessageLite *)local_2c8,output);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (gtest_ar_.success_) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          local_300.data_._0_4_ = 0;
          absl::lts_20250127::Cord::operator_cast_to_string(&local_2e8,output);
          local_308._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2e8._M_string_length;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&gtest_ar_,"0","this->GetOutput().size()",(int *)&local_300,
                     (unsigned_long *)&local_308);
          std::__cxx11::string::~string((string *)&local_2e8);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_2e8);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar2 = anon_var_dwarf_651463 + 5;
            }
            else {
              pcVar2 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_308,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                       ,0x475,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_308,(Message *)&local_2e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
            if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
            }
          }
          goto LAB_00701f6a;
        }
        testing::Message::Message((Message *)&local_308);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2e8,(internal *)&gtest_ar_,
                   (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_300,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x474,local_2e8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
      }
      else {
        testing::Message::Message((Message *)&local_308);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2e8,(internal *)&gtest_ar_,
                   (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_300,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x46f,local_2e8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
      }
    }
    else {
      testing::Message::Message((Message *)&local_308);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2e8,(internal *)&gtest_ar_,
                 (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_300,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x46b,local_2e8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
    }
  }
  else {
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e8,(internal *)&gtest_ar_,
               (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x454,local_2e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_300);
  std::__cxx11::string::~string((string *)&local_2e8);
  if (local_308._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_308._M_head_impl + 8))();
  }
LAB_00701f6a:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_2c8);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, DontSerializeDefaultValuesTest) {
  // check that serialized data contains only non-zero numeric fields/non-empty
  // string/byte fields.
  TestAllTypes message;
  TypeParam& output_sink = this->GetOutputSinkRef();

  // All default values -> no output.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  // Zero values -> still no output.
  message.set_optional_int32(0);
  message.set_optional_int64(0);
  message.set_optional_uint32(0);
  message.set_optional_uint64(0);
  message.set_optional_sint32(0);
  message.set_optional_sint64(0);
  message.set_optional_fixed32(0);
  message.set_optional_fixed64(0);
  message.set_optional_sfixed32(0);
  message.set_optional_sfixed64(0);
  message.set_optional_float(0);
  message.set_optional_double(0);
  message.set_optional_bool(false);
  message.set_optional_string("");
  message.set_optional_bytes("");
  message.set_optional_nested_enum(TestAllTypes::FOO);  // first enum entry
  message.set_optional_foreign_enum(FOREIGN_FOO);       // first enum entry
  message.set_optional_string_piece("");

  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());

  message.set_optional_int32(1);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(2, this->GetOutput().size());
  EXPECT_EQ("\x08\x01", this->GetOutput());

  message.set_optional_int32(0);
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(0, this->GetOutput().size());
}